

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int setDateTimeToCurrent(sqlite3_context *context,DateTime *p)

{
  int iVar1;
  
  iVar1 = sqlite3OsCurrentTimeInt64(((context->s).db)->pVfs,&p->iJD);
  if (iVar1 == 0) {
    p->validJD = '\x01';
  }
  return (uint)(iVar1 != 0);
}

Assistant:

static int setDateTimeToCurrent(sqlite3_context *context, DateTime *p){
  sqlite3 *db = sqlite3_context_db_handle(context);
  if( sqlite3OsCurrentTimeInt64(db->pVfs, &p->iJD)==SQLITE_OK ){
    p->validJD = 1;
    return 0;
  }else{
    return 1;
  }
}